

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O3

ggml_tensor *
ggml_opt_step_adamw(ggml_context *ctx,ggml_tensor *a,ggml_tensor *grad,ggml_tensor *m,ggml_tensor *v
                   ,ggml_tensor *adamw_params)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  ggml_tensor *pgVar5;
  char *pcVar6;
  int line;
  
  if ((a->flags & 4) == 0) {
    pcVar6 = "a->flags & GGML_TENSOR_FLAG_PARAM";
    line = 0x1413;
  }
  else {
    lVar1 = a->ne[0];
    if ((((lVar1 == grad->ne[0]) && (lVar2 = a->ne[1], lVar2 == grad->ne[1])) &&
        (lVar3 = a->ne[2], lVar3 == grad->ne[2])) && (lVar4 = a->ne[3], lVar4 == grad->ne[3])) {
      if (((lVar1 == m->ne[0]) && (lVar2 == m->ne[1])) &&
         ((lVar3 == m->ne[2] && (lVar4 == m->ne[3])))) {
        if (((lVar1 == v->ne[0]) && (lVar2 == v->ne[1])) &&
           ((lVar3 == v->ne[2] && (lVar4 == v->ne[3])))) {
          if (adamw_params->type == GGML_TYPE_F32) {
            if (adamw_params->ne[1] * adamw_params->ne[0] * adamw_params->ne[2] *
                adamw_params->ne[3] == 7) {
              pgVar5 = ggml_view_tensor(ctx,a);
              pgVar5->op = GGML_OP_OPT_STEP_ADAMW;
              pgVar5->src[0] = a;
              pgVar5->src[1] = grad;
              pgVar5->src[2] = m;
              pgVar5->src[3] = v;
              pgVar5->src[4] = adamw_params;
              return pgVar5;
            }
            pcVar6 = "ggml_nelements(adamw_params) == 7";
            line = 0x1418;
          }
          else {
            pcVar6 = "adamw_params->type == GGML_TYPE_F32";
            line = 0x1417;
          }
        }
        else {
          pcVar6 = "ggml_are_same_shape(a, v)";
          line = 0x1416;
        }
      }
      else {
        pcVar6 = "ggml_are_same_shape(a, m)";
        line = 0x1415;
      }
    }
    else {
      pcVar6 = "ggml_are_same_shape(a, grad)";
      line = 0x1414;
    }
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c",line,
             "GGML_ASSERT(%s) failed",pcVar6);
}

Assistant:

struct ggml_tensor * ggml_opt_step_adamw(
        struct ggml_context * ctx,
        struct ggml_tensor  * a,
        struct ggml_tensor  * grad,
        struct ggml_tensor  * m,
        struct ggml_tensor  * v,
        struct ggml_tensor  * adamw_params) {
    GGML_ASSERT(a->flags & GGML_TENSOR_FLAG_PARAM);
    GGML_ASSERT(ggml_are_same_shape(a, grad));
    GGML_ASSERT(ggml_are_same_shape(a, m));
    GGML_ASSERT(ggml_are_same_shape(a, v));
    GGML_ASSERT(adamw_params->type == GGML_TYPE_F32);
    GGML_ASSERT(ggml_nelements(adamw_params) == 7);

    struct ggml_tensor * result = ggml_view_tensor(ctx, a);

    result->op     = GGML_OP_OPT_STEP_ADAMW;
    result->src[0] = a;
    result->src[1] = grad;
    result->src[2] = m;
    result->src[3] = v;
    result->src[4] = adamw_params;

    return result;
}